

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

char * __thiscall pstack::Exception::what(Exception *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->intermediate,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (this->intermediate)._M_dataplus._M_p;
}

Assistant:

const char *what() const noexcept {
        intermediate = str.str();
        return intermediate.c_str();
    }